

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall github111116::ConsoleLogger::print<char[33]>(ConsoleLogger *this,char (*t) [33])

{
  char *in_RSI;
  undefined8 *in_RDI;
  
  std::operator<<((ostream *)*in_RDI,in_RSI);
  print((ConsoleLogger *)0x19aefd);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t)
{
	out << t;
	print();
}